

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O3

const_iterator * __thiscall
compressed_sparse_matrix<filtration_entry_t>::cend
          (const_iterator *__return_storage_ptr__,compressed_sparse_matrix<filtration_entry_t> *this
          ,size_t index)

{
  unsigned_long __n;
  _Elt_pointer pfVar1;
  _Elt_pointer pfVar2;
  _Map_pointer ppfVar3;
  ulong uVar4;
  _Elt_pointer puVar5;
  ulong uVar6;
  _Self *__tmp;
  
  pfVar1 = (this->entries).
           super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
           super__Deque_impl_data._M_start._M_first;
  pfVar2 = (this->entries).
           super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
           super__Deque_impl_data._M_start._M_last;
  ppfVar3 = (this->entries).
            super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
            super__Deque_impl_data._M_start._M_node;
  puVar5 = (this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  uVar4 = ((long)puVar5 -
           (long)(this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + index;
  if ((long)uVar4 < 0) {
    uVar6 = (long)uVar4 >> 6;
  }
  else {
    if (uVar4 < 0x40) {
      puVar5 = puVar5 + index;
      goto LAB_00138386;
    }
    uVar6 = uVar4 >> 6;
  }
  puVar5 = (this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_start._M_node[uVar6] + uVar4 + uVar6 * -0x40;
LAB_00138386:
  __n = *puVar5;
  __return_storage_ptr__->_M_cur =
       (this->entries).super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
       _M_impl.super__Deque_impl_data._M_start._M_cur;
  __return_storage_ptr__->_M_first = pfVar1;
  __return_storage_ptr__->_M_last = pfVar2;
  __return_storage_ptr__->_M_node = ppfVar3;
  std::_Deque_iterator<filtration_entry_t,_const_filtration_entry_t_&,_const_filtration_entry_t_*>::
  operator+=(__return_storage_ptr__,__n);
  return __return_storage_ptr__;
}

Assistant:

typename std::deque<ValueType>::const_iterator cend(size_t index) const {
		assert(index < size());
		return entries.cbegin() + bounds[index];
	}